

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double buffon_pdf(double a,double l)

{
  char *pcVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (a < 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BUFFON_PDF - Fatal error!\n");
    pcVar1 = "  Input A < 0.\n";
LAB_00194f12:
    std::operator<<((ostream *)&std::cerr,pcVar1);
    exit(1);
  }
  if ((a != 0.0) || (NAN(a))) {
    if (l < 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"BUFFON_PDF - Fatal error!\n");
      pcVar1 = "  Input L < 0.\n";
      goto LAB_00194f12;
    }
    if ((l != 0.0) || (NAN(l))) {
      dVar2 = (l + l) / (a * 3.141592653589793);
    }
  }
  else {
    dVar2 = 1.0;
  }
  return dVar2;
}

Assistant:

double buffon_pdf ( double a, double l )

//****************************************************************************80
//
//  Purpose:
//
//    BUFFON_PDF evaluates the Buffon PDF.
//
//  Discussion:
//
//    In the Buffon needle experiment, we suppose that the plane has been
//    ruled by vertical lines with a spacing of A units, and that a
//    needle of length L is dropped "at random" onto this grid.
//
//    Because of the various symmetries, we may assume that this eye of
//    this needle lands in the first infinite strip, and we may further
//    assume that its Y coordinate is 0.  Thus, we have
//    the eye as (X1,Y1) with 0 <= X1 <= A and Y1 = 0.
//
//    ANGLE, the angle that the needle makes is taken to be uniformly random.
//    The point of the needle, (X2,Y2), therefore lies at
//
//      (X2,Y2) = ( X1+L*cos(ANGLE), Y1+L*sin(ANGLE) )
//
//    The needle will have crossed at least one grid line if any of the
//    following are true:
//
//      X2 <= 0, A <= X2.
//
//    The probability of a crossing on a single trial is
//
//      P(A,L) = ( 2 * L ) / ( PI * A )
//
//    and therefore, a record of the number of hits for a given number of
//    trials can be used as a very roundabout way of estimating PI.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the horizontal spacing between the
//    vertical grid lines.  0 <= A.
//
//    Input, double L, the length of the needle.
//
//    Output, double BUFFON_PDF, the Buffon PDF.
//
{
  double pdf;
  const double r8_pi = 3.141592653589793238462643;

  if ( a < 0.0 )
  {
    cerr << "\n";
    cerr << "BUFFON_PDF - Fatal error!\n";
    cerr << "  Input A < 0.\n";
    exit ( 1 );
  }
  else if ( a == 0.0 )
  {
    pdf = 1.0;
    return pdf;
  }

  if ( l < 0.0 )
  {
    cerr << "\n";
    cerr << "BUFFON_PDF - Fatal error!\n";
    cerr << "  Input L < 0.\n";
    exit ( 1 );
  }
  else if ( l == 0.0 )
  {
    pdf = 0.0;
    return pdf;
  }

  pdf = ( 2.0 * l ) / ( r8_pi * a );

  return pdf;
}